

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O2

int jas_image_ishomosamp(jas_image_t *image)

{
  jas_image_cmpt_t *pjVar1;
  jas_image_cmpt_t *pjVar2;
  uint i;
  ulong uVar3;
  
  pjVar1 = *image->cmpts_;
  uVar3 = 0;
  do {
    if (image->numcmpts_ <= uVar3) {
      return 1;
    }
    pjVar2 = image->cmpts_[uVar3];
  } while ((pjVar2->hstep_ == pjVar1->hstep_) &&
          (uVar3 = uVar3 + 1, pjVar2->vstep_ == pjVar1->vstep_));
  return 0;
}

Assistant:

int jas_image_ishomosamp(const jas_image_t *image)
{
	jas_image_coord_t hstep;
	jas_image_coord_t vstep;
	int result;
	hstep = jas_image_cmpthstep(image, 0);
	vstep = jas_image_cmptvstep(image, 0);
	result = 1;
	for (unsigned i = 0; i < image->numcmpts_; ++i) {
		if (jas_image_cmpthstep(image, i) != hstep ||
		  jas_image_cmptvstep(image, i) != vstep) {
			result = 0;
			break;
		}
	}
	return result;
}